

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O1

void test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
               (SquareMatrix<double> *m1,SquareMatrix<double> *m2,double eps)

{
  double unaff_RBX;
  pointer *__ptr;
  ulong uVar1;
  char *message;
  char *unaff_R12;
  ulong uVar2;
  AssertionResult gtest_ar;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffa8;
  char local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  AssertHelper in_stack_ffffffffffffffc8;
  
  if (m1->size_ == m2->size_) {
    if (m1->size_ != 0) {
      uVar1 = 0;
      do {
        if (m1->size_ != 0) {
          uVar2 = 0;
          do {
            testing::internal::DoubleNearPredFormat
                      ((char *)in_stack_ffffffffffffffa8._M_head_impl,(char *)0x128bdb,unaff_R12,
                       unaff_RBX,(double)in_stack_ffffffffffffffc8.data_,eps);
            if (local_50 == '\0') {
              testing::Message::Message((Message *)&stack0xffffffffffffffa8);
              message = "";
              if (local_48 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                message = (local_48->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/circuit.cpp"
                         ,0xe,message);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xffffffffffffffc8,
                         (Message *)&stack0xffffffffffffffa8);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xffffffffffffffc8);
              if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   )in_stack_ffffffffffffffa8._M_head_impl !=
                  (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   )0x0) {
                (**(code **)(*(long *)in_stack_ffffffffffffffa8._M_head_impl + 8))();
              }
            }
            if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_48,local_48);
            }
            uVar2 = uVar2 + 1;
          } while (uVar2 < (ulong)m1->size_);
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < (ulong)m1->size_);
    }
    return;
  }
  __assert_fail("m1.size() == m2.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/circuit.cpp"
                ,0xb,
                "void test_qpixl_frqi_check_matrix(const MAT1 &, const MAT2 &, const R) [MAT1 = qclab::dense::SquareMatrix<double>, MAT2 = qclab::dense::SquareMatrix<double>, R = double]"
               );
}

Assistant:

void test_qpixl_frqi_check_matrix( const MAT1& m1, const MAT2& m2, const R eps ) {
  assert( m1.size() == m2.size() ) ;
  for ( size_t i = 0; i < m1.size(); i++ ) {
    for ( size_t j = 0; j < m1.size(); j++ ) {
      EXPECT_NEAR( m1(i,j) , m2(i,j)  , eps );
    }
  }
}